

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

Block * __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::
requisition_block<(moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::AllocationMode)0>
          (ConcurrentQueue<_zframe_t*,MyTraits> *this)

{
  Block *pBVar1;
  
  pBVar1 = ConcurrentQueue<_zframe_t_*,_MyTraits>::try_get_block_from_initial_pool
                     ((ConcurrentQueue<_zframe_t_*,_MyTraits> *)this);
  if (pBVar1 == (Block *)0x0) {
    pBVar1 = ConcurrentQueue<_zframe_t_*,_MyTraits>::
             FreeList<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block>::try_get
                       ((FreeList<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block> *)
                        (this + 0x28));
    if (pBVar1 == (Block *)0x0) {
      pBVar1 = create<moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::Block>();
      return pBVar1;
    }
  }
  return pBVar1;
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}
		
		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}
		
		if (canAlloc == CanAlloc) {
			return create<Block>();
		}
		
		return nullptr;
	}